

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O2

int __thiscall kws::Parser::IsInClass(Parser *this,size_t position)

{
  char *pcVar1;
  bool bVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  size_t sVar6;
  bool bVar7;
  allocator local_a1;
  size_t local_a0;
  ulong local_98;
  string local_90;
  string local_70;
  string local_50;
  
  local_a0 = position;
  std::__cxx11::string::string((string *)&local_90,"",&local_a1);
  uVar5 = 0;
  sVar4 = GetClassPosition(this,0,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  do {
    if (sVar4 == 0xffffffffffffffff) {
      return (int)uVar5;
    }
    uVar3 = sVar4;
    do {
      sVar6 = uVar3 + 1;
      if ((sVar6 == 0) || ((this->m_BufferNoComment)._M_string_length <= uVar3)) break;
      pcVar1 = (this->m_BufferNoComment)._M_dataplus._M_p + uVar3;
      uVar3 = sVar6;
    } while (*pcVar1 != '{');
    local_98 = uVar5;
    std::__cxx11::string::string((string *)&local_50,"",&local_a1);
    sVar6 = FindClosingChar(this,'{','}',sVar6,true,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    bVar7 = sVar4 < local_a0;
    bVar2 = local_a0 < sVar6;
    std::__cxx11::string::string((string *)&local_70,"",&local_a1);
    sVar4 = GetClassPosition(this,sVar4 + 1,&local_70);
    uVar5 = (ulong)((int)local_98 + (uint)(bVar7 && bVar2));
    std::__cxx11::string::~string((string *)&local_70);
  } while( true );
}

Assistant:

int Parser::IsInClass(size_t position) const
{
  int inClass = 0;
  size_t classPos = this->GetClassPosition(0);
  while(classPos!=std::string::npos)
    {
    size_t i=classPos;
    while(i!=std::string::npos && i<m_BufferNoComment.size())
      {
      if(m_BufferNoComment[i] == '{')
        {
        break;
        }
      i++;
      }
    size_t classEnd = this->FindClosingChar('{','}',i+1,true);

    if(position>classPos && position<classEnd)
      {
      inClass++;
      }
    classPos = this->GetClassPosition(classPos+1);
    }

  return inClass;
}